

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2cfb1b::FilteredDirectoryContentsTask::provideValue
          (FilteredDirectoryContentsTask *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,
          ValueType *value)

{
  BuildValue local_80;
  
  if (inputID == 1) {
    llbuild::buildsystem::BuildValue::fromData(&local_80,value);
    llbuild::buildsystem::BuildValue::operator=(&this->directoryValue,&local_80);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  }
  return;
}

Assistant:

virtual void provideValue(TaskInterface, uintptr_t inputID,
                            const KeyType& key, const ValueType& value) override {
    if (inputID == 1) {
      directoryValue = BuildValue::fromData(value);
      return;
    }
  }